

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_config.c
# Opt level: O1

int get_self_ip_iface(CMTransport_trace trace_func,void *trace_data,char *iface)

{
  ushort uVar1;
  uint uVar2;
  ushort *puVar3;
  long lVar4;
  long *plVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  in_addr_t iVar9;
  char *pcVar10;
  hostent *phVar11;
  void *pvVar12;
  char *pcVar13;
  size_t __n;
  uint uVar14;
  in_addr *in_1;
  uint *puVar15;
  long **pplVar16;
  in_addr *in;
  char **ppcVar17;
  long *plVar18;
  ifaddrs *if_addrs;
  ifconf ifaces;
  char buf [46];
  char str_2 [16];
  char hostname_buf [256];
  long *local_190;
  int local_188 [2];
  void *local_180;
  char local_178 [48];
  char local_148 [16];
  char local_138 [264];
  
  pplVar16 = &local_190;
  local_190 = (long *)0x0;
  iVar7 = getifaddrs(pplVar16);
  if (iVar7 == 0) {
    pcVar10 = iface;
    if (local_190 != (long *)0x0) {
      plVar18 = local_190;
      do {
        puVar3 = (ushort *)plVar18[3];
        if (puVar3 != (ushort *)0x0) {
          uVar1 = *puVar3;
          pcVar10 = (char *)(ulong)uVar1;
          if ((uVar1 & 0xfff7) == 2) {
            lVar4 = plVar18[1];
            pcVar13 = inet_ntop((uint)uVar1,puVar3 + (ulong)(uVar1 != 2) * 2 + 2,local_178,0x2e);
            (*trace_func)((CManager)trace_data,"CM<IP_CONFIG> IP possibility -> %s : %s",lVar4,
                          pcVar13);
            if ((uVar1 == 2) && ((get_self_ip_iface_first_call & 1) == 0)) {
              pcVar10 = (char *)plVar18[1];
              iVar7 = 2;
              pcVar13 = inet_ntop(2,puVar3 + (ulong)(uVar1 != 2) * 2 + 2,local_178,0x2e);
              dump_output(iVar7,"\tADIOS2_IP_CONFIG Possible interface %s : IPV4 %s\n",pcVar10,
                          pcVar13);
            }
          }
        }
        plVar18 = (long *)*plVar18;
      } while (plVar18 != (long *)0x0);
    }
    pcVar13 = iface;
    if (iface == (char *)0x0) {
      pcVar13 = getenv("ADIOS2_INTERFACE");
    }
    iface = pcVar10;
    if (pcVar13 == (char *)0x0) {
LAB_00104e8a:
      get_self_ip_iface_first_call = 1;
      gethostname(local_138,0x100);
      pcVar10 = index(local_138,0x2e);
      if (pcVar10 == (char *)0x0) {
        phVar11 = (hostent *)0x0;
      }
      else {
        phVar11 = gethostbyname(local_138);
      }
      if (phVar11 != (hostent *)0x0) {
        ppcVar17 = phVar11->h_addr_list;
        puVar15 = (uint *)*ppcVar17;
        if (puVar15 != (uint *)0x0) {
          do {
            ppcVar17 = ppcVar17 + 1;
            uVar14 = *puVar15;
            if ((char)uVar14 != '\x7f') {
              inet_ntop(2,puVar15,(char *)local_188,0x10);
              (*trace_func)((CManager)trace_data,
                            "CM<IP_CONFIG> Prefer IP associated with hostname net -> %s",local_188);
              free(local_190);
              uVar2 = *puVar15;
              iface = (char *)(ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 |
                                      (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
            }
            if ((char)uVar14 != '\x7f') {
              return (int)iface;
            }
            puVar15 = (uint *)*ppcVar17;
          } while (puVar15 != (uint *)0x0);
        }
      }
      pplVar16 = &local_190;
      do {
        pplVar16 = (long **)*pplVar16;
        if (pplVar16 == (long **)0x0) goto LAB_00104a1f;
        plVar18 = pplVar16[3];
        bVar6 = true;
        if (((plVar18 != (long *)0x0) && ((short)*plVar18 == 2)) && (((ulong)pplVar16[2] & 8) == 0))
        {
          plVar5 = pplVar16[1];
          pcVar10 = inet_ntop(2,(short *)((long)plVar18 + 4),local_178,0x2e);
          bVar6 = false;
          (*trace_func)((CManager)trace_data,
                        "CM<IP_CONFIG> get_self_ip_addr returning first avail -> %s : %s",plVar5,
                        pcVar10);
          uVar14 = *(uint *)((long)plVar18 + 4);
          iface = (char *)(ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8
                                 | uVar14 << 0x18);
          free(local_190);
        }
        iVar9 = (in_addr_t)iface;
      } while (bVar6);
    }
    else {
      pvVar12 = trace_data;
      (*trace_func)((CManager)trace_data,"CM<IP_CONFIG> searching for interface %s\n",pcVar13);
      if (get_self_ip_iface_first_call == 0) {
        dump_output((int)pvVar12,"\tADIOS2_IP_CONFIG interface %s requested\n",pcVar13);
      }
      do {
        pplVar16 = (long **)*pplVar16;
        if (pplVar16 == (long **)0x0) {
          printf("Warning!  ADIOS2_INTERFACE specified as \"%s\", but no active interface by that name found\n"
                 ,pcVar13);
          iface = pcVar10;
          goto LAB_00104e8a;
        }
        plVar18 = pplVar16[3];
        bVar6 = true;
        if ((plVar18 != (long *)0x0) && ((short)*plVar18 == 2)) {
          plVar5 = pplVar16[1];
          __n = strlen(pcVar13);
          iVar7 = strncmp((char *)plVar5,pcVar13,__n);
          if (iVar7 == 0) {
            puVar15 = (uint *)((long)plVar18 + 4);
            pcVar10 = inet_ntop(2,puVar15,local_178,0x2e);
            (*trace_func)((CManager)trace_data,
                          "CM<IP_CONFIG> Interface specified, returning ->%s : %s",plVar5,pcVar10);
            if (get_self_ip_iface_first_call == 0) {
              iVar7 = 2;
              pcVar10 = inet_ntop(2,puVar15,local_178,0x2e);
              dump_output(iVar7,"\tADIOS2_IP_CONFIG interface %s found, using IP %s\n",pcVar13,
                          pcVar10);
            }
            uVar14 = *puVar15;
            pcVar10 = (char *)(ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 |
                                      (uVar14 & 0xff00) << 8 | uVar14 << 0x18);
            free(local_190);
            get_self_ip_iface_first_call = 1;
            bVar6 = false;
          }
        }
        iVar9 = (in_addr_t)pcVar10;
      } while (bVar6);
    }
  }
  else {
    phVar11 = (hostent *)0x0;
LAB_00104a1f:
    gethostname(local_138,0x100);
    pcVar10 = strchr(local_138,0x2e);
    if (pcVar10 != (char *)0x0) {
      phVar11 = gethostbyname(local_138);
    }
    if (phVar11 != (hostent *)0x0) {
      ppcVar17 = phVar11->h_addr_list;
      puVar15 = (uint *)*ppcVar17;
      if (puVar15 != (uint *)0x0) {
        do {
          ppcVar17 = ppcVar17 + 1;
          uVar14 = *puVar15;
          if ((char)uVar14 != '\x7f') {
            inet_ntop(2,puVar15,(char *)local_188,0x10);
            uVar2 = *puVar15;
            (*trace_func)((CManager)trace_data,"CM<IP_CONFIG> - Get self IP addr %lx, net %s",
                          (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                                 uVar2 << 0x18),local_188);
            uVar2 = *puVar15;
            iface = (char *)(ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8
                                   | uVar2 << 0x18);
          }
          if ((char)uVar14 != '\x7f') {
            return (int)iface;
          }
          puVar15 = (uint *)*ppcVar17;
        } while (puVar15 != (uint *)0x0);
      }
    }
    iVar9 = 0;
    iVar7 = socket(2,2,0);
    local_188[0] = 0xa00;
    pvVar12 = malloc(0xa00);
    local_180 = pvVar12;
    iVar8 = ioctl(iVar7,0x8912,local_188);
    if ((-1 < iVar8) && (iVar8 = (int)((ulong)(long)local_188[0] / 0x28), iVar8 != 0)) {
      puVar15 = (uint *)((long)local_180 + 0x14);
      iVar9 = 0;
      do {
        iVar8 = iVar8 + -1;
        ioctl(iVar7,0x8913,puVar15 + -5);
        uVar14 = puVar15[-1];
        if ((uVar14 & 8) == 0) {
          if ((uVar14 & 1) == 0) {
            uVar14 = *puVar15;
            uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                     uVar14 << 0x18;
            pcVar10 = "CM<IP_CONFIG> - Get self IP addr %lx, rejected, not UP";
          }
          else {
            uVar2 = *puVar15;
            if ((uVar14 & 0x40) != 0) {
              bVar6 = false;
              if ((uVar2 != 0) && (bVar6 = false, uVar2 != 0x7f000001)) {
                iVar9 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        uVar2 << 0x18;
                inet_ntop(2,puVar15,local_148,0x10);
                uVar14 = *puVar15;
                (*trace_func)((CManager)trace_data,
                              "CM<IP_CONFIG> - Get self IP addr DHCP %lx, net %s",
                              (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 |
                                      (uVar14 & 0xff00) << 8 | uVar14 << 0x18),local_148);
                bVar6 = true;
              }
              goto LAB_00104bbc;
            }
            uVar14 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
            ;
            pcVar10 = "CM<IP_CONFIG> - Get self IP addr %lx, rejected, not RUNNING";
          }
          (*trace_func)((CManager)trace_data,pcVar10,(ulong)uVar14);
          bVar6 = false;
        }
        else {
          pcVar10 = inet_ntoa((in_addr)*puVar15);
          bVar6 = false;
          (*trace_func)((CManager)trace_data,
                        "CM<IP_CONFIG> - Get self IP addr %s, rejected, loopback",pcVar10);
        }
LAB_00104bbc:
      } while ((!bVar6) && (puVar15 = puVar15 + 10, iVar8 != 0));
    }
    close(iVar7);
    free(pvVar12);
    if (iVar9 == 0) {
      pcVar10 = getenv("ADIOS2_LAST_RESORT_IP_ADDR");
      iVar9 = 0;
      (*trace_func)((CManager)trace_data,"CM<IP_CONFIG> - Get self IP addr at last resort");
      if (pcVar10 != (char *)0x0) {
        (*trace_func)((CManager)trace_data,"CM<IP_CONFIG> - Translating last resort %s",pcVar10);
        iVar9 = inet_addr(pcVar10);
      }
    }
  }
  return iVar9;
}

Assistant:

static int
get_self_ip_iface(CMTransport_trace trace_func, void* trace_data, char *iface)
{
    struct hostent *host = NULL;
    char hostname_buf[256];
    char **p;
#ifdef HAVE_GETIFADDRS
  struct ifaddrs *if_addrs = NULL;
  struct ifaddrs *if_addr = NULL;
  void *tmp = NULL;
  char buf[INET6_ADDRSTRLEN];
#endif
#ifdef SIOCGIFCONF
    char *ifreqs;
    struct ifreq *ifr;
    struct sockaddr_in *sai;
    struct ifconf ifaces;
    int ifrn;
    int ss;
    int ipv4_count = 0;
    int ipv6_count = 0;
    static int first_call = 1;
#endif
    int rv = 0;
#ifdef HAVE_GETIFADDRS
    if (getifaddrs(&if_addrs) == 0) {    
	// Print possible addresses
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if ((family != AF_INET) && (family != AF_INET6)) continue;
	    if (if_addr->ifa_addr->sa_family == AF_INET) {
	        tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		ipv4_count++;
	    } else {
	        tmp = &((struct sockaddr_in6 *)if_addr->ifa_addr)->sin6_addr;
		ipv6_count++;
	    }
	    trace_func(trace_data, "CM<IP_CONFIG> IP possibility -> %s : %s",
		       if_addr->ifa_name,
		       inet_ntop(family, tmp, buf, sizeof(buf)));
	    if ((family == AF_INET) && first_call) {
		dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG Possible interface %s : IPV4 %s\n",
			    if_addr->ifa_name,
			    inet_ntop(family, tmp, buf, sizeof(buf)));
	    } else {
		// until we support IPV6, don't dump info
		//dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG Possible interface %s : IPV6 %s\n",
		//	    if_addr->ifa_name,
		//	    inet_ntop(family, tmp, buf, sizeof(buf)));
	    }
	}
	if (!iface) iface = getenv(IPCONFIG_ENVVAR_PREFIX "INTERFACE");
	if (iface != NULL) {
	    trace_func(trace_data, "CM<IP_CONFIG> searching for interface %s\n", iface);
	    if (first_call) dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG interface %s requested\n", iface);
	    for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	        int family;
		uint32_t IP;
	        if (!if_addr->ifa_addr) continue;
		family = if_addr->ifa_addr->sa_family;
		if (family != AF_INET) continue;  /* currently not looking for ipv6 */
		if (strncmp(if_addr->ifa_name, iface, strlen(iface)) != 0) continue;
		tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		trace_func(trace_data, "CM<IP_CONFIG> Interface specified, returning ->%s : %s",
			   if_addr->ifa_name,
			   inet_ntop(family, tmp, buf, sizeof(buf)));
		if (first_call)
		dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG interface %s found, using IP %s\n", iface,
			   inet_ntop(family, tmp, buf, sizeof(buf)));
		IP = ntohl(*(uint32_t*)tmp);
		free(if_addrs);
		first_call = 0;
		return IP;
	    }
	    printf("Warning!  " IPCONFIG_ENVVAR_PREFIX "INTERFACE specified as \"%s\", but no active interface by that name found\n", iface);
	}
	    
	first_call = 0;
	gethostname(hostname_buf, sizeof(hostname_buf));
	if (index(hostname_buf, '.') != NULL) {
	    /* don't even check for host if not fully qualified */
	    host = gethostbyname(hostname_buf);
	}
	if (host != NULL) {
	    for (p = host->h_addr_list; *p != 0; p++) {
		struct in_addr *in = *(struct in_addr **) p;
		if (!ipv4_is_loopback(ntohl(in->s_addr))) {
		    char str[INET_ADDRSTRLEN];
					      
		    inet_ntop(AF_INET, &(in->s_addr), str, sizeof(str));
		    trace_func(trace_data, "CM<IP_CONFIG> Prefer IP associated with hostname net -> %s", str);
		    free(if_addrs);
		    return (ntohl(in->s_addr));
		}
	    }
	}
	/* choose the first thing that's not a loopback interface */
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    uint32_t ret_ip;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if (family != AF_INET) continue;  /* currently not looking for ipv6 */
	    if ((if_addr->ifa_flags & IFF_LOOPBACK) != 0)  continue;
	    tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
	    trace_func(trace_data, "CM<IP_CONFIG> get_self_ip_addr returning first avail -> %s : %s",
			       if_addr->ifa_name,
			       inet_ntop(family, tmp, buf, sizeof(buf)));
	    ret_ip = (ntohl(*(uint32_t*)tmp));
	    free(if_addrs);
	    return ret_ip;
	}
    }
#endif	
    gethostname(hostname_buf, sizeof(hostname_buf));
    if (strchr(hostname_buf, '.') != NULL) {
	/* don't even check for host if not fully qualified */
	host = gethostbyname(hostname_buf);
    }
    if (host != NULL) {
	for (p = host->h_addr_list; *p != 0; p++) {
	    struct in_addr *in = *(struct in_addr **) p;
	    if (!ipv4_is_loopback(ntohl(in->s_addr))) {
	        char str[INET_ADDRSTRLEN];
					      
		inet_ntop(AF_INET, &(in->s_addr), str, sizeof(str));
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %lx, net %s",
			   ntohl(in->s_addr), str);
		return (ntohl(in->s_addr));
	    }
	}
    }
    /*
     *  Since we couldn't find an IP address in some logical way, we'll open
     *  a DGRAM socket and ask it first for the list of its interfaces, and
     *  then checking for an interface we can use, and then finally asking that
     *  interface what its address is.
     */
#ifdef SIOCGIFCONF
    ss = socket(AF_INET, SOCK_DGRAM, 0);
    ifaces.ifc_len = 64 * sizeof(struct ifreq);
    ifaces.ifc_buf = ifreqs = malloc(ifaces.ifc_len);
    /*
     *  if we can't SIOCGIFCONF we're kind of dead anyway, bail.
     */
    if (ioctl(ss, SIOCGIFCONF, &ifaces) >= 0) {
	ifr = ifaces.ifc_req;
	ifrn = ifaces.ifc_len / sizeof(struct ifreq);
	for (; ifrn--; ifr++) {
	    char str[INET_ADDRSTRLEN];
	    /*
	     * Basically we'll take the first interface satisfying 
	     * the following: 
	     *   up, running, not loopback, address family is INET.
	     */
	    ioctl(ss, SIOCGIFFLAGS, ifr);
	    sai = (struct sockaddr_in *) &(ifr->ifr_addr);
	    if (ifr->ifr_flags & IFF_LOOPBACK) {
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %s, rejected, loopback",
			   inet_ntoa(sai->sin_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_UP)) {
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %lx, rejected, not UP",
			   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_RUNNING)) {
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %lx, rejected, not RUNNING",
			   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    /*
	     * sure would be nice to test for AF_INET here but it doesn't
	     * cooperate and I've done enough for now ...
	     * if (sai->sin_addr.s.addr != AF_INET) continue;
	    */
	    if (sai->sin_addr.s_addr == INADDR_ANY)
		continue;
	    if (sai->sin_addr.s_addr == INADDR_LOOPBACK)
		continue;
	    rv = ntohl(sai->sin_addr.s_addr);
					      
	    inet_ntop(AF_INET, &(sai->sin_addr.s_addr), str, sizeof(str));
	    trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr DHCP %lx, net %s",
		       ntohl(sai->sin_addr.s_addr), str);
	    break;
	}
    }
    close(ss);
    free(ifreqs);
#endif
    /*
     *  Absolute last resort.  If we can't figure out anything else, look
     *  for the CM_LAST_RESORT_IP_ADDR environment variable.
     */
    if (rv == 0) {
	char *c = getenv(IPCONFIG_ENVVAR_PREFIX "LAST_RESORT_IP_ADDR");
	trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr at last resort");
	if (c != NULL) {
	    trace_func(trace_data, "CM<IP_CONFIG> - Translating last resort %s", c);
	    rv = inet_addr(c);
	}
    }
    /*
     *	hopefully by now we've set rv to something useful.  If not,
     *  GET A BETTER NETWORK CONFIGURATION.
     */
    return rv;
}